

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDate.cpp
# Opt level: O0

void __thiscall
PDFDate::SetTime(PDFDate *this,int inYear,int inMonth,int inDay,int inHour,int inMinute,int inSecond
                ,EUTCRelation inUTC,int inHourFromUTC,int inMinuteFromUTC)

{
  int inMinute_local;
  int inHour_local;
  int inDay_local;
  int inMonth_local;
  int inYear_local;
  PDFDate *this_local;
  
  this->Year = inYear;
  this->Month = inMonth;
  this->Day = inDay;
  this->Hour = inHour;
  this->Minute = inMinute;
  this->Second = inSecond;
  this->UTC = inUTC;
  this->HourFromUTC = inHourFromUTC;
  this->MinuteFromUTC = inMinuteFromUTC;
  return;
}

Assistant:

void PDFDate::SetTime(	int inYear,
						int inMonth,
						int inDay,
						int inHour,
						int inMinute,
						int inSecond,
						EUTCRelation inUTC,
						int inHourFromUTC,
						int inMinuteFromUTC)
{
	Year = inYear;
	Month = inMonth;
	Day = inDay;
	Hour = inHour;
	Minute = inMinute;
	Second = inSecond;
	UTC = inUTC;
	HourFromUTC = inHourFromUTC;
	MinuteFromUTC = inMinuteFromUTC;
}